

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_cwriter_add(Curl_easy *data,Curl_cwriter *writer)

{
  bool bVar1;
  Curl_cwriter **local_30;
  Curl_cwriter **anchor;
  CURLcode result;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  local_30 = &(data->req).writer_stack;
  if ((*local_30 != (Curl_cwriter *)0x0) ||
     (data_local._4_4_ = do_init_writer_stack(data), data_local._4_4_ == CURLE_OK)) {
    while( true ) {
      bVar1 = false;
      if (*local_30 != (Curl_cwriter *)0x0) {
        bVar1 = (*local_30)->phase < writer->phase;
      }
      if (!bVar1) break;
      local_30 = &(*local_30)->next;
    }
    writer->next = *local_30;
    *local_30 = writer;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_cwriter_add(struct Curl_easy *data,
                          struct Curl_cwriter *writer)
{
  CURLcode result;
  struct Curl_cwriter **anchor = &data->req.writer_stack;

  if(!*anchor) {
    result = do_init_writer_stack(data);
    if(result)
      return result;
  }

  /* Insert the writer as first in its phase.
   * Skip existing writers of lower phases. */
  while(*anchor && (*anchor)->phase < writer->phase)
    anchor = &((*anchor)->next);
  writer->next = *anchor;
  *anchor = writer;
  return CURLE_OK;
}